

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O0

void rect(double x,double y,double w,double h)

{
  double t;
  double r;
  double h_local;
  double w_local;
  double y_local;
  double x_local;
  
  fl_begin_polygon();
  fl_vertex(x,y);
  fl_vertex(x + w,y);
  fl_vertex(x + w,y + h);
  fl_vertex(x,y + h);
  fl_end_polygon();
  return;
}

Assistant:

static void rect(double x, double y, double w, double h) {
  double r = x+w;
  double t = y+h;
  fl_begin_polygon();
  fl_vertex(x, y);
  fl_vertex(r, y);
  fl_vertex(r, t);
  fl_vertex(x, t);
  fl_end_polygon();
}